

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servak.cpp
# Opt level: O3

string_view mime_type(string_view path)

{
  bool bVar1;
  size_type pos;
  char *pcVar2;
  long lVar3;
  char cVar4;
  long lVar5;
  char cVar6;
  char cVar7;
  char *pcVar8;
  size_t sVar9;
  string_view sVar10;
  basic_string_view<char,_std::char_traits<char>_> s;
  string_view rhs;
  string_view rhs_00;
  string_view rhs_01;
  string_view rhs_02;
  string_view rhs_03;
  string_view rhs_04;
  string_view rhs_05;
  string_view rhs_06;
  string_view rhs_07;
  string_view rhs_08;
  string_view rhs_09;
  string_view rhs_10;
  string_view rhs_11;
  string_view rhs_12;
  string_view rhs_13;
  basic_string_view<char,_std::char_traits<char>_> local_30;
  
  s.len_ = 1;
  s.ptr_ = ".";
  pos = boost::basic_string_view<char,_std::char_traits<char>_>::rfind
                  (&local_30,s,0xffffffffffffffff);
  if (pos == 0xffffffffffffffff) {
    sVar10 = (string_view)ZEXT816(0);
  }
  else {
    sVar10 = boost::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&local_30,pos,0xffffffffffffffff);
    sVar9 = sVar10.len_;
    pcVar2 = sVar10.ptr_;
    if (sVar9 == 3) {
      lVar3 = 0;
      pcVar8 = "application/javascript";
      sVar9 = 0x16;
      do {
        if (lVar3 == 3) goto LAB_0010cb35;
        cVar6 = pcVar2[lVar3];
        cVar4 = ".js"[lVar3];
        lVar3 = lVar3 + 1;
      } while (cVar6 == cVar4);
      do {
        cVar7 = cVar6 + ' ';
        if (0x19 < (int)cVar6 - 0x41U) {
          cVar7 = cVar6;
        }
        cVar6 = cVar4 + ' ';
        if (0x19 < (int)cVar4 - 0x41U) {
          cVar6 = cVar4;
        }
        if (cVar7 != cVar6) goto LAB_0010c758;
        cVar6 = pcVar2[lVar3];
        cVar4 = ".js"[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 4);
      goto LAB_0010cb35;
    }
    if (sVar9 == 4) {
      lVar3 = 0;
      pcVar8 = "text/html";
      sVar9 = 9;
      do {
        if (lVar3 == 4) goto LAB_0010cb35;
        cVar6 = pcVar2[lVar3];
        cVar4 = ".htm"[lVar3];
        lVar3 = lVar3 + 1;
      } while (cVar6 == cVar4);
      lVar5 = 0;
      do {
        cVar7 = cVar6 + ' ';
        if (0x19 < (int)cVar6 - 0x41U) {
          cVar7 = cVar6;
        }
        cVar6 = cVar4 + ' ';
        if (0x19 < (int)cVar4 - 0x41U) {
          cVar6 = cVar4;
        }
        if (cVar7 != cVar6) {
          lVar3 = 0;
          pcVar8 = "text/html";
          sVar9 = 9;
          goto LAB_0010c8dc;
        }
        cVar6 = pcVar2[lVar3 + lVar5];
        cVar4 = ".htm"[lVar3 + lVar5];
        lVar5 = lVar5 + 1;
      } while (5 - lVar3 != lVar5);
      goto LAB_0010cb35;
    }
    if (sVar9 == 5) {
      lVar3 = 0;
      pcVar8 = "text/html";
      sVar9 = 9;
      do {
        if (lVar3 == 5) goto LAB_0010cb35;
        cVar6 = pcVar2[lVar3];
        cVar4 = "index.html"[lVar3 + 5];
        lVar3 = lVar3 + 1;
      } while (cVar6 == cVar4);
      do {
        cVar7 = cVar6 + ' ';
        if (0x19 < (int)cVar6 - 0x41U) {
          cVar7 = cVar6;
        }
        cVar6 = cVar4 + ' ';
        if (0x19 < (int)cVar4 - 0x41U) {
          cVar6 = cVar4;
        }
        if (cVar7 != cVar6) goto LAB_0010c758;
        cVar6 = pcVar2[lVar3];
        cVar4 = "index.html"[lVar3 + 5];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 6);
      goto LAB_0010cb35;
    }
  }
LAB_0010c758:
  rhs.len_ = 5;
  rhs.ptr_ = ".json";
  bVar1 = boost::beast::iequals(sVar10,rhs);
  if (bVar1) {
    sVar9 = 0x10;
    pcVar8 = "application/json";
  }
  else {
    rhs_00.len_ = 4;
    rhs_00.ptr_ = ".xml";
    bVar1 = boost::beast::iequals(sVar10,rhs_00);
    if (bVar1) {
      sVar9 = 0xf;
      pcVar8 = "application/xml";
    }
    else {
      rhs_01.len_ = 4;
      rhs_01.ptr_ = ".swf";
      bVar1 = boost::beast::iequals(sVar10,rhs_01);
      if (bVar1) {
        sVar9 = 0x1d;
        pcVar8 = "application/x-shockwave-flash";
      }
      else {
        rhs_02.len_ = 4;
        rhs_02.ptr_ = ".flv";
        bVar1 = boost::beast::iequals(sVar10,rhs_02);
        if (bVar1) {
          sVar9 = 0xb;
          pcVar8 = "video/x-flv";
        }
        else {
          rhs_03.len_ = 4;
          rhs_03.ptr_ = ".png";
          bVar1 = boost::beast::iequals(sVar10,rhs_03);
          if (bVar1) {
            pcVar8 = "image/png";
          }
          else {
            rhs_04.len_ = 4;
            rhs_04.ptr_ = ".jpe";
            bVar1 = boost::beast::iequals(sVar10,rhs_04);
            sVar9 = 10;
            pcVar8 = "image/jpeg";
            if (((bVar1) ||
                (rhs_05.len_ = 5, rhs_05.ptr_ = ".jpeg",
                bVar1 = boost::beast::iequals(sVar10,rhs_05), bVar1)) ||
               (rhs_06.len_ = 4, rhs_06.ptr_ = ".jpg", bVar1 = boost::beast::iequals(sVar10,rhs_06),
               bVar1)) goto LAB_0010cb35;
            rhs_07.len_ = 4;
            rhs_07.ptr_ = ".gif";
            bVar1 = boost::beast::iequals(sVar10,rhs_07);
            if (bVar1) {
              pcVar8 = "image/gif";
            }
            else {
              rhs_08.len_ = 4;
              rhs_08.ptr_ = ".bmp";
              bVar1 = boost::beast::iequals(sVar10,rhs_08);
              if (!bVar1) {
                rhs_09.len_ = 4;
                rhs_09.ptr_ = ".ico";
                bVar1 = boost::beast::iequals(sVar10,rhs_09);
                if (bVar1) {
                  sVar9 = 0x18;
                  pcVar8 = "image/vnd.microsoft.icon";
                }
                else {
                  rhs_10.len_ = 5;
                  rhs_10.ptr_ = ".tiff";
                  bVar1 = boost::beast::iequals(sVar10,rhs_10);
                  pcVar8 = "image/tiff";
                  if ((!bVar1) &&
                     (rhs_11.len_ = 4, rhs_11.ptr_ = ".tif",
                     bVar1 = boost::beast::iequals(sVar10,rhs_11), !bVar1)) {
                    rhs_12.len_ = 4;
                    rhs_12.ptr_ = ".svg";
                    bVar1 = boost::beast::iequals(sVar10,rhs_12);
                    if (bVar1) {
                      sVar9 = 0xd;
                      pcVar8 = "image/svg+xml";
                    }
                    else {
                      rhs_13.len_ = 5;
                      rhs_13.ptr_ = ".svgz";
                      bVar1 = boost::beast::iequals(sVar10,rhs_13);
                      pcVar8 = "application/text";
                      if (bVar1) {
                        pcVar8 = "image/svg+xml";
                      }
                      sVar9 = (ulong)!bVar1 * 3 + 0xd;
                    }
                  }
                }
                goto LAB_0010cb35;
              }
              pcVar8 = "image/bmp";
            }
          }
          sVar9 = 9;
        }
      }
    }
  }
  goto LAB_0010cb35;
  while( true ) {
    cVar6 = pcVar2[lVar3];
    cVar4 = ".php"[lVar3];
    lVar3 = lVar3 + 1;
    if (cVar6 != cVar4) break;
LAB_0010c8dc:
    if (lVar3 == 4) goto LAB_0010cb35;
  }
  lVar5 = 0;
  do {
    cVar7 = cVar6 + ' ';
    if (0x19 < (int)cVar6 - 0x41U) {
      cVar7 = cVar6;
    }
    cVar6 = cVar4 + ' ';
    if (0x19 < (int)cVar4 - 0x41U) {
      cVar6 = cVar4;
    }
    if (cVar7 != cVar6) {
      lVar3 = 0;
      pcVar8 = "text/css";
      sVar9 = 8;
      goto LAB_0010ca47;
    }
    cVar6 = pcVar2[lVar3 + lVar5];
    cVar4 = ".php"[lVar3 + lVar5];
    lVar5 = lVar5 + 1;
  } while (5 - lVar3 != lVar5);
  goto LAB_0010cb35;
  while( true ) {
    cVar6 = pcVar2[lVar3];
    cVar4 = ".css"[lVar3];
    lVar3 = lVar3 + 1;
    if (cVar6 != cVar4) break;
LAB_0010ca47:
    if (lVar3 == 4) goto LAB_0010cb35;
  }
  do {
    cVar7 = cVar6 + ' ';
    if (0x19 < (int)cVar6 - 0x41U) {
      cVar7 = cVar6;
    }
    cVar6 = cVar4 + ' ';
    if (0x19 < (int)cVar4 - 0x41U) {
      cVar6 = cVar4;
    }
    if (cVar7 != cVar6) {
      lVar3 = 0;
      pcVar8 = "text/plain";
      sVar9 = 10;
      goto LAB_0010cb88;
    }
    cVar6 = pcVar2[lVar3];
    cVar4 = ".css"[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  goto LAB_0010cb35;
  while( true ) {
    cVar6 = pcVar2[lVar3];
    cVar4 = ".txt"[lVar3];
    lVar3 = lVar3 + 1;
    if (cVar6 != cVar4) break;
LAB_0010cb88:
    if (lVar3 == 4) goto LAB_0010cb35;
  }
  do {
    cVar7 = cVar6 + ' ';
    if (0x19 < (int)cVar6 - 0x41U) {
      cVar7 = cVar6;
    }
    cVar6 = cVar4 + ' ';
    if (0x19 < (int)cVar4 - 0x41U) {
      cVar6 = cVar4;
    }
    if (cVar7 != cVar6) goto LAB_0010c758;
    cVar6 = pcVar2[lVar3];
    cVar4 = ".txt"[lVar3];
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
LAB_0010cb35:
  sVar10.len_ = sVar9;
  sVar10.ptr_ = pcVar8;
  return sVar10;
}

Assistant:

beast::string_view
mime_type(beast::string_view path)
{
    using beast::iequals;
    auto const ext = [&path]
    {
        auto const pos = path.rfind(".");
        if(pos == beast::string_view::npos)
            return beast::string_view{};
        return path.substr(pos);
    }();
    if(iequals(ext, ".htm"))  return "text/html";
    if(iequals(ext, ".html")) return "text/html";
    if(iequals(ext, ".php"))  return "text/html";
    if(iequals(ext, ".css"))  return "text/css";
    if(iequals(ext, ".txt"))  return "text/plain";
    if(iequals(ext, ".js"))   return "application/javascript";
    if(iequals(ext, ".json")) return "application/json";
    if(iequals(ext, ".xml"))  return "application/xml";
    if(iequals(ext, ".swf"))  return "application/x-shockwave-flash";
    if(iequals(ext, ".flv"))  return "video/x-flv";
    if(iequals(ext, ".png"))  return "image/png";
    if(iequals(ext, ".jpe"))  return "image/jpeg";
    if(iequals(ext, ".jpeg")) return "image/jpeg";
    if(iequals(ext, ".jpg"))  return "image/jpeg";
    if(iequals(ext, ".gif"))  return "image/gif";
    if(iequals(ext, ".bmp"))  return "image/bmp";
    if(iequals(ext, ".ico"))  return "image/vnd.microsoft.icon";
    if(iequals(ext, ".tiff")) return "image/tiff";
    if(iequals(ext, ".tif"))  return "image/tiff";
    if(iequals(ext, ".svg"))  return "image/svg+xml";
    if(iequals(ext, ".svgz")) return "image/svg+xml";
    return "application/text";
}